

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance
          (EpsCopyOutputStream *this,int size,uint8_t **pp)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  
  if ((this->had_error_ != true) && (uVar1 = Flush(this,*pp), this->had_error_ != true)) {
    uVar3 = uVar1 - size;
    if (size <= (int)uVar1) {
      puVar2 = this->buffer_end_;
      puVar4 = puVar2 + size;
      puVar5 = (uint8_t *)0x0;
      puVar6 = puVar4 + ((ulong)uVar3 - 0x10);
      if ((int)uVar3 < 0x11) {
        puVar5 = puVar4;
        puVar6 = this->buffer_ + (int)uVar3;
      }
      this->end_ = puVar6;
      this->buffer_end_ = puVar5;
      puVar6 = this->buffer_;
      if (0x10 < (int)uVar3) {
        puVar6 = puVar4;
      }
      goto LAB_0045fd6a;
    }
    if (0x10 < (int)uVar1) {
      puVar6 = this->buffer_end_;
      this->end_ = puVar6 + ((ulong)uVar1 - 0x10);
      this->buffer_end_ = (uint8_t *)0x0;
      puVar2 = (uint8_t *)0x0;
      goto LAB_0045fd6a;
    }
    this->end_ = this->buffer_ + (int)uVar1;
  }
  puVar2 = (uint8_t *)0x0;
  puVar6 = this->buffer_;
LAB_0045fd6a:
  *pp = puVar6;
  return puVar2;
}

Assistant:

uint8_t* EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance(int size,
                                                               uint8_t** pp) {
  if (had_error_) {
    *pp = buffer_;
    return nullptr;
  }
  int s = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return nullptr;
  }
  if (s >= size) {
    auto res = buffer_end_;
    *pp = SetInitialBuffer(buffer_end_ + size, s - size);
    return res;
  } else {
    *pp = SetInitialBuffer(buffer_end_, s);
    return nullptr;
  }
}